

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseMultiplyDivide(StructuralParser *this)

{
  bool bVar1;
  Op op;
  Expression *a;
  TokenType token;
  Expression *b;
  Context context;
  Context CStack_48;
  
  a = parseUnary(this);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)0x2c9772,(TokenType)0x2a2995,(TokenType)0x2a3523);
    if (!bVar1) break;
    getContext(&CStack_48,this);
    token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::skip(&this->super_SOULTokeniser);
    op = getBinaryOpForToken(token);
    b = parseUnary(this);
    a = createBinaryOperator(this,&CStack_48,a,b,op);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&CStack_48);
  }
  return a;
}

Assistant:

AST::Expression& parseMultiplyDivide()
    {
        for (pool_ref<AST::Expression> a = parseUnary();;)
        {
            if (! matchesAny (Operator::times, Operator::divide, Operator::modulo))
                return a;

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseUnary(), type);
        }
    }